

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSShape *sh;
  JSValue new_target;
  JSValue new_target_00;
  JSValueUnion JVar1;
  JSValueUnion JVar2;
  JSValue method;
  int iVar3;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  uint uVar7;
  int64_t iVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t iVar11;
  ulong uVar12;
  JSValue v;
  JSValue v_00;
  JSValue func_obj;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue func_obj_00;
  JSValue this_obj;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue this_obj_00;
  JSValue prop;
  JSValue method_00;
  JSValue this_obj_01;
  JSValue val;
  int64_t len;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar21;
  JSValueUnion local_100;
  JSValueUnion local_f0;
  int64_t iStack_e8;
  ulong local_d0;
  ulong local_c8;
  void *local_c0;
  JSValueUnion local_b8;
  int64_t local_b0;
  ulong local_a8;
  undefined8 local_a0;
  undefined8 local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80;
  int64_t local_78;
  ulong local_70;
  int32_t local_68;
  undefined4 uStack_64;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  int64_t local_40;
  JSValueUnion local_38;
  
  JVar17.tag = iStack_e8;
  JVar17.u.float64 = local_f0.float64;
  local_f0 = this_val.u;
  JVar5 = *(JSValueUnion *)&(argv->u).int32;
  iVar8 = argv->tag;
  JVar16 = *argv;
  JVar14 = *argv;
  JVar13 = *argv;
  local_68 = 0;
  local_60 = 3;
  local_58.int32 = 0;
  local_50 = 3;
  local_90 = 1;
  if (argc < 2) {
    iVar11 = 3;
    uVar10 = 0;
    local_c8 = 0;
    uVar9 = 3;
    local_c0 = (void *)0x0;
    local_d0 = 1;
LAB_00167be4:
    uVar18 = 0;
    JVar13 = JS_GetPropertyInternal(ctx,JVar13,0xc6,JVar14,0);
    JVar4 = JVar13.u;
    uVar7 = (uint)JVar13.tag;
    local_100._0_4_ = this_val.tag._0_4_;
    if (uVar7 == 3) {
      JVar13 = JS_ToObject(ctx,JVar16);
      if (((int)JVar13.tag == 6) ||
         (iVar3 = js_get_length64(ctx,(int64_t *)&local_88,JVar13), iVar3 < 0)) goto LAB_00167d86;
      uVar12 = CONCAT44(uStack_84,local_88);
      JVar5._4_4_ = 0;
      JVar5.int32 = local_88;
      local_b8.float64 = (double)(long)uVar12;
      if ((long)(int)local_88 == uVar12) {
        local_b8 = JVar5;
      }
      local_b0 = 7;
      if ((long)(int)local_88 == uVar12) {
        local_b0 = 0;
      }
      if ((local_100._0_4_ == -1) && ((*(byte *)((long)local_f0.ptr + 5) & 0x10) != 0)) {
        local_80 = uVar10;
        local_78 = iVar11;
        local_70 = uVar9;
        JVar14 = JS_CallConstructorInternal(ctx,this_val,this_val,1,(JSValue *)&local_b8,2);
      }
      else {
        local_80 = uVar10;
        local_78 = iVar11;
        local_70 = uVar9;
        JVar14 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_b8);
      }
      uVar9 = (ulong)JVar14.u.ptr >> 0x20;
      if ((int)JVar14.tag != 6) {
        if ((long)uVar12 < 1) {
          uVar12 = 0;
        }
        else {
          JVar5.ptr = (void *)(local_c8 | local_80);
          uVar10 = 0;
          do {
            JVar16 = JS_GetPropertyInt64(ctx,JVar13,uVar10);
            if ((uint)JVar16.tag == 6) goto LAB_00167e31;
            JVar17 = JVar16;
            if ((char)local_90 == '\0') {
              local_a8 = uVar10 & 0xffffffff;
              local_a0 = 0;
              new_target_00.tag._0_4_ = 3;
              new_target_00.u.ptr = (void *)((ulong)local_f0.ptr & 0xffffffff00000000);
              new_target_00.tag._4_4_ = 0;
              func_obj_00.tag = local_70;
              func_obj_00.u.ptr = (void *)((ulong)local_c0 & 0xffffffff | local_d0 << 0x20);
              this_obj_01.tag = local_78;
              this_obj_01.u.ptr = JVar5.ptr;
              _local_b8 = JVar16;
              JVar17 = JS_CallInternal(ctx,func_obj_00,this_obj_01,new_target_00,2,
                                       (JSValue *)&local_b8,2);
              if ((0xfffffff4 < (uint)JVar16.tag) &&
                 (iVar3 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar3 + -1, iVar3 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar16);
              }
              if ((int)JVar17.tag == 6) goto LAB_00167e31;
            }
            local_f0 = JVar17.u;
            JVar4.float64 = (double)(long)uVar10;
            if (uVar10 < 0x80000000) {
              JVar4.ptr = (void *)(uVar10 & 0xffffffff);
            }
            iVar8 = 7;
            if (uVar10 < 0x80000000) {
              iVar8 = 0;
            }
            JVar16.tag = iVar8;
            JVar16.u.float64 = JVar4.float64;
            iVar3 = JS_DefinePropertyValueValue(ctx,JVar14,JVar16,JVar17,0x4007);
            if (iVar3 < 0) goto LAB_00167e31;
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
LAB_001683c4:
        local_100 = JVar14.u;
        uVar7 = (uint)uVar12;
        JVar6._0_4_ = uVar7 & 0x7fffffff;
        JVar6._4_4_ = 0;
        JVar5.float64 = (double)(uVar12 & 0xffffffff);
        if (-1 < (int)uVar7) {
          JVar5 = JVar6;
        }
        iVar8 = 7;
        if (-1 < (int)uVar7) {
          iVar8 = 0;
        }
        this_obj.u.ptr = (void *)((ulong)local_100.ptr & 0xffffffff | uVar9 << 0x20);
        this_obj.tag = JVar14.tag;
        val.tag = iVar8;
        val.u.float64 = JVar5.float64;
        iVar3 = JS_SetPropertyInternal(ctx,this_obj,0x30,val,0x4000);
        if (-1 < iVar3) goto LAB_00167e71;
      }
    }
    else {
      if (uVar7 == 6) {
        JVar13 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_00167d86;
      }
      if ((0xfffffff4 < uVar7) && (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
        local_b8 = JVar4;
        __JS_FreeValueRT(ctx->rt,JVar13);
      }
      local_b8.ptr = local_f0.ptr;
      if ((local_100._0_4_ == -1) && ((*(byte *)((long)local_f0.ptr + 5) & 0x10) != 0)) {
        in_stack_fffffffffffffee0 = 2;
        uVar18 = 0;
        in_stack_fffffffffffffedc = 0;
        local_80 = uVar10;
        local_78 = iVar11;
        local_70 = uVar9;
        JVar14 = JS_CallConstructorInternal(ctx,this_val,this_val,0,(JSValue *)0x0,2);
      }
      else {
        sh = ctx->array_shape;
        (sh->header).ref_count = (sh->header).ref_count + 1;
        local_80 = uVar10;
        local_78 = iVar11;
        local_70 = uVar9;
        JVar14 = JS_NewObjectFromShape(ctx,sh,2);
      }
      uVar9 = (ulong)JVar14.u.ptr >> 0x20;
      if ((int)JVar14.tag != 6) {
        local_b8.float64 = JVar5.float64;
        if (0xfffffff4 < (uint)iVar8) {
          *(int *)JVar5.ptr = *JVar5.ptr + 1;
        }
        local_68 = JVar5.int32;
        uStack_64 = JVar5._4_4_;
        local_60 = iVar8;
        iVar3 = js_for_of_start(ctx,(JSValue *)&local_58,0);
        iVar8 = local_60;
        if (iVar3 == 0) {
          JVar4._4_4_ = uStack_64;
          JVar4.int32 = local_68;
          JVar13.u._4_4_ = uStack_64;
          JVar13.u.int32 = local_68;
          JVar13.tag = local_60;
          local_38._4_4_ = local_58._4_4_;
          local_38.int32 = local_58.int32;
          method.u._4_4_ = local_58._4_4_;
          method.u.int32 = local_58.int32;
          method.tag = local_50;
          local_40 = local_50;
          JVar13 = JS_IteratorNext(ctx,JVar13,method,(int)&local_88,
                                   (JSValue *)CONCAT44(in_stack_fffffffffffffedc,uVar18),
                                   (BOOL *)CONCAT44(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0));
          if ((int)JVar13.tag != 6) {
            JVar5.ptr = (void *)(local_c8 | local_80);
            uVar12 = 0;
            do {
              if (local_88 != 0) {
                JVar13 = (JSValue)(ZEXT816(3) << 0x40);
                goto LAB_001683c4;
              }
              JVar16 = JVar13;
              if ((char)local_90 == '\0') {
                local_a8 = uVar12 & 0xffffffff;
                local_a0 = 0;
                new_target.tag._0_4_ = 3;
                new_target.u.ptr = (void *)((ulong)JVar17.u._4_4_ << 0x20);
                new_target.tag._4_4_ = 0;
                func_obj.tag = local_70;
                func_obj.u.ptr = (void *)((ulong)local_c0 & 0xffffffff | local_d0 << 0x20);
                this_obj_00.tag = local_78;
                this_obj_00.u.ptr = JVar5.ptr;
                _local_b8 = JVar13;
                JVar16 = JS_CallInternal(ctx,func_obj,this_obj_00,new_target,2,(JSValue *)&local_b8,
                                         2);
                if ((0xfffffff4 < (uint)JVar13.tag) &&
                   (iVar3 = *JVar13.u.ptr, *(int *)JVar13.u.ptr = iVar3 + -1, iVar3 < 2)) {
                  __JS_FreeValueRT(ctx->rt,JVar13);
                }
                if ((int)JVar16.tag == 6) break;
              }
              JVar6.float64 = (double)(long)uVar12;
              if (uVar12 < 0x80000000) {
                JVar6.ptr = (void *)(uVar12 & 0xffffffff);
              }
              iVar11 = 7;
              if (uVar12 < 0x80000000) {
                iVar11 = 0;
              }
              uVar18 = JVar16.u._0_4_;
              uVar19 = JVar16.u._4_4_;
              uVar20 = (undefined4)JVar16.tag;
              uVar21 = JVar16.tag._4_4_;
              prop.tag = iVar11;
              prop.u.float64 = JVar6.float64;
              iVar3 = JS_DefinePropertyValueValue(ctx,JVar14,prop,JVar16,0x4007);
              if (iVar3 < 0) break;
              uVar12 = uVar12 + 1;
              enum_obj.tag = iVar8;
              enum_obj.u.ptr = JVar4.ptr;
              method_00.tag = local_40;
              method_00.u.float64 = local_38.float64;
              JVar13 = JS_IteratorNext(ctx,enum_obj,method_00,(int)&local_88,
                                       (JSValue *)CONCAT44(uVar19,uVar18),
                                       (BOOL *)CONCAT44(uVar21,uVar20));
              JVar17 = JVar16;
            } while ((int)JVar13.tag != 6);
          }
          if ((int)iVar8 != 3) {
            enum_obj_00.tag = iVar8;
            enum_obj_00.u.ptr = JVar4.ptr;
            JS_IteratorClose(ctx,enum_obj_00,1);
          }
          JVar13 = (JSValue)(ZEXT816(3) << 0x40);
          goto LAB_00167e31;
        }
      }
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    }
  }
  else {
    local_c0 = argv[1].u.ptr;
    uVar9 = argv[1].tag;
    local_d0 = (ulong)local_c0 >> 0x20;
    if ((int)uVar9 == 3) {
LAB_00167baa:
      iVar11 = 3;
      uVar10 = 0;
      local_c8 = 0;
      goto LAB_00167be4;
    }
    iVar3 = check_function(ctx,argv[1]);
    if (iVar3 == 0) {
      if (argc != 2) {
        iVar11 = argv[2].tag;
        local_c8 = (ulong)argv[2].u.ptr & 0xffffffff00000000;
        uVar10 = (ulong)argv[2].u.ptr & 0xffffffff;
        local_90 = 0;
        goto LAB_00167be4;
      }
      local_90 = 0;
      goto LAB_00167baa;
    }
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00167d86:
    JVar14 = (JSValue)(ZEXT816(3) << 0x40);
  }
LAB_00167e31:
  uVar9 = uVar9 << 0x20;
  JVar5.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar9);
  if ((0xfffffff4 < (uint)JVar14.tag) &&
     (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
    JVar14.tag = JVar14.tag;
    JVar14.u.ptr = JVar5.ptr;
    __JS_FreeValueRT(ctx->rt,JVar14);
  }
  JVar14 = (JSValue)(ZEXT816(6) << 0x40);
LAB_00167e71:
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar3 = *JVar13.u.ptr, *(int *)JVar13.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar13);
  }
  JVar1._4_4_ = uStack_64;
  JVar1.int32 = local_68;
  if ((0xfffffff4 < (uint)local_60) &&
     (iVar3 = *JVar1.ptr, *(int *)JVar1.ptr = iVar3 + -1, iVar3 < 2)) {
    v.tag = local_60;
    v.u.ptr = JVar1.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar2._4_4_ = local_58._4_4_;
  JVar2.int32 = local_58.int32;
  if ((0xfffffff4 < (uint)local_50) &&
     (iVar3 = *JVar2.ptr, *(int *)JVar2.ptr = iVar3 + -1, iVar3 < 2)) {
    v_00.tag = local_50;
    v_00.u.ptr = JVar2.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  JVar15.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar9 << 0x20);
  JVar15.tag = JVar14.tag;
  return JVar15;
}

Assistant:

static JSValue js_array_from(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, r, v, v2, arrayLike;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arrayLike = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        if (JS_IsConstructor(ctx, this_val))
            r = JS_CallConstructor(ctx, this_val, 0, NULL);
        else
            r = JS_NewArray(ctx);
        if (JS_IsException(r))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception_close;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arrayLike = JS_ToObject(ctx, items);
        if (JS_IsException(arrayLike))
            goto exception;
        if (js_get_length64(ctx, &len, arrayLike) < 0)
            goto exception;
        v = JS_NewInt64(ctx, len);
        args[0] = v;
        if (JS_IsConstructor(ctx, this_val)) {
            r = JS_CallConstructor(ctx, this_val, 1, args);
        } else {
            r = js_array_constructor(ctx, JS_UNDEFINED, 1, args);
        }
        JS_FreeValue(ctx, v);
        if (JS_IsException(r))
            goto exception;
        for(k = 0; k < len; k++) {
            v = JS_GetPropertyInt64(ctx, arrayLike, k);
            if (JS_IsException(v))
                goto exception;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, r, JS_ATOM_length, JS_NewUint32(ctx, k)) < 0)
        goto exception;
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arrayLike);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}